

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ColumnDefault(Vdbe *v,Table *pTab,int i,int iReg)

{
  u8 enc_00;
  Column *pCVar1;
  int iVar2;
  sqlite3 *psVar3;
  Column *pCol;
  sqlite3_value *psStack_28;
  u8 enc;
  sqlite3_value *pValue;
  int iReg_local;
  int i_local;
  Table *pTab_local;
  Vdbe *v_local;
  
  pValue._0_4_ = iReg;
  pValue._4_4_ = i;
  _iReg_local = pTab;
  pTab_local = (Table *)v;
  if (pTab->pSelect == (Select *)0x0) {
    psStack_28 = (sqlite3_value *)0x0;
    psVar3 = sqlite3VdbeDb(v);
    iVar2 = pValue._4_4_;
    enc_00 = psVar3->enc;
    pCVar1 = _iReg_local->aCol;
    psVar3 = sqlite3VdbeDb((Vdbe *)pTab_local);
    sqlite3ValueFromExpr
              (psVar3,pCVar1[iVar2].pDflt,enc_00,pCVar1[iVar2].affinity,&stack0xffffffffffffffd8);
    if (psStack_28 != (sqlite3_value *)0x0) {
      sqlite3VdbeAppendP4((Vdbe *)pTab_local,psStack_28,-0xb);
    }
  }
  if (_iReg_local->aCol[pValue._4_4_].affinity == 'E') {
    sqlite3VdbeAddOp1((Vdbe *)pTab_local,0x54,(int)pValue);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnDefault(Vdbe *v, Table *pTab, int i, int iReg){
  assert( pTab!=0 );
  if( !pTab->pSelect ){
    sqlite3_value *pValue = 0;
    u8 enc = ENC(sqlite3VdbeDb(v));
    Column *pCol = &pTab->aCol[i];
    VdbeComment((v, "%s.%s", pTab->zName, pCol->zName));
    assert( i<pTab->nCol );
    sqlite3ValueFromExpr(sqlite3VdbeDb(v), pCol->pDflt, enc, 
                         pCol->affinity, &pValue);
    if( pValue ){
      sqlite3VdbeAppendP4(v, pValue, P4_MEM);
    }
  }
#ifndef SQLITE_OMIT_FLOATING_POINT
  if( pTab->aCol[i].affinity==SQLITE_AFF_REAL ){
    sqlite3VdbeAddOp1(v, OP_RealAffinity, iReg);
  }
#endif
}